

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::PrimitivesGeneratedQueryObjectQueryCase::iterate
          (PrimitivesGeneratedQueryObjectQueryCase *this)

{
  TestLog *log;
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  allocator<char> local_135;
  GLuint query;
  string local_130;
  CallLogWrapper gl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  code *local_78;
  GLenum local_70;
  ResultCollector result;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130," // ERROR: ",(allocator<char> *)&local_f8);
  tcu::ResultCollector::ResultCollector(&result,log,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  gl.m_enableLog = true;
  query = 0;
  deqp::gls::StateQueryUtil::verifyStateQueryInteger(&result,&gl,0x8c87,0x8865,0,QUERY_QUERY);
  glu::CallLogWrapper::glGenQueries(&gl,1,&query);
  GVar2 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Got Error ",&local_135);
    local_78 = glu::getErrorName;
    local_70 = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_78);
    std::operator+(&local_98,&local_b8,&local_d8);
    std::operator+(&local_f8,&local_98,": ");
    std::operator+(&local_130,&local_f8,"glGenQueries");
    tcu::ResultCollector::fail(&result,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  glu::CallLogWrapper::glBeginQuery(&gl,0x8c87,query);
  GVar2 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Got Error ",&local_135);
    local_78 = glu::getErrorName;
    local_70 = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_78);
    std::operator+(&local_98,&local_b8,&local_d8);
    std::operator+(&local_f8,&local_98,": ");
    std::operator+(&local_130,&local_f8,"beginQuery");
    tcu::ResultCollector::fail(&result,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  deqp::gls::StateQueryUtil::verifyStateQueryInteger(&result,&gl,0x8c87,0x8865,query,QUERY_QUERY);
  glu::CallLogWrapper::glEndQuery(&gl,0x8c87);
  GVar2 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Got Error ",&local_135);
    local_78 = glu::getErrorName;
    local_70 = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_78);
    std::operator+(&local_98,&local_b8,&local_d8);
    std::operator+(&local_f8,&local_98,": ");
    std::operator+(&local_130,&local_f8,"endQuery");
    tcu::ResultCollector::fail(&result,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

PrimitivesGeneratedQueryObjectQueryCase::IterateResult PrimitivesGeneratedQueryObjectQueryCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		glw::GLuint query = 0;

		verifyStateQueryInteger(result, gl, GL_PRIMITIVES_GENERATED, GL_CURRENT_QUERY, 0, QUERY_QUERY);

		gl.glGenQueries(1, &query);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGenQueries");

		gl.glBeginQuery(GL_PRIMITIVES_GENERATED, query);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "beginQuery");

		verifyStateQueryInteger(result, gl, GL_PRIMITIVES_GENERATED, GL_CURRENT_QUERY, (int)query, QUERY_QUERY);

		gl.glEndQuery(GL_PRIMITIVES_GENERATED);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "endQuery");
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}